

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example.cc
# Opt level: O1

void __thiscall TC_parser<false>::nameSpace(TC_parser<false> *this)

{
  example *this_00;
  char cVar1;
  uint uVar2;
  char *pos;
  char *begin;
  char *message;
  
  this->cur_channel_v = 1.0;
  this->index = '\0';
  this->new_index = false;
  this->anon = 0;
  pos = this->reading_head;
  cVar1 = *pos;
  if ((((cVar1 == '\t') || (cVar1 == ' ')) || (pos == this->endLine)) || (cVar1 == '|')) {
LAB_00273f4d:
    this->index = ' ';
    if ((this->ae->super_example_predict).feature_space[0x20].values._end ==
        (this->ae->super_example_predict).feature_space[0x20].values._begin) {
      this->new_index = true;
    }
    uVar2 = this->hash_seed;
    if (uVar2 == 0) {
      uVar2 = 0;
    }
    else {
      uVar2 = (uVar2 >> 0x10 ^ uVar2) * -0x7a143595;
      uVar2 = (uVar2 >> 0xd ^ uVar2) * -0x3d4d51cb;
      uVar2 = uVar2 >> 0x10 ^ uVar2;
    }
    this->channel_hash = (ulong)uVar2;
    while( true ) {
      pos = this->reading_head;
      cVar1 = *pos;
      if (((cVar1 != ' ') && (cVar1 != '\t')) || (this->endLine <= pos)) break;
      this->reading_head = pos + 1;
      maybeFeature(this);
    }
LAB_00274000:
    if (((pos == this->endLine) || (cVar1 == '\r')) || (cVar1 == '|')) goto LAB_00274029;
    begin = this->beginLine;
    message = "malformed example! \'|\',space, or EOL expected after : \"";
  }
  else {
    if (cVar1 != ':') {
      if (cVar1 == '\r') goto LAB_00273f4d;
      nameSpaceInfo(this);
      while( true ) {
        pos = this->reading_head;
        cVar1 = *pos;
        if (((cVar1 != ' ') && (cVar1 != '\t')) || (this->endLine <= pos)) break;
        this->reading_head = pos + 1;
        maybeFeature(this);
      }
      goto LAB_00274000;
    }
    begin = this->beginLine;
    message = "malformed example! \'|\',String,space, or EOL expected after : \"";
  }
  parserWarning(this,message,begin,pos,"\"");
LAB_00274029:
  if ((this->new_index == true) &&
     (this_00 = this->ae,
     (this_00->super_example_predict).feature_space[this->index].values._end !=
     (this_00->super_example_predict).feature_space[this->index].values._begin)) {
    v_array<unsigned_char>::push_back((v_array<unsigned_char> *)this_00,&this->index);
    return;
  }
  return;
}

Assistant:

inline void nameSpace()
  {
    cur_channel_v = 1.0;
    index = 0;
    new_index = false;
    anon = 0;
    if (*reading_head == ' ' || *reading_head == '\t' || reading_head == endLine || *reading_head == '|' ||
        *reading_head == '\r')
    {
      // NameSpace --> ListFeatures
      index = (unsigned char)' ';
      if (ae->feature_space[index].size() == 0)
        new_index = true;
      if (audit)
      {
        if (base != nullptr)
          free(base);
        base = calloc_or_throw<char>(2);
        base[0] = ' ';
        base[1] = '\0';
      }
      channel_hash = this->hash_seed == 0 ? 0 : uniform_hash("", 0, this->hash_seed);
      listFeatures();
    }
    else if (*reading_head != ':')
    {
      // NameSpace --> NameSpaceInfo ListFeatures
      nameSpaceInfo();
      listFeatures();
    }
    else
    {
      // syntax error
      parserWarning("malformed example! '|',String,space, or EOL expected after : \"", beginLine, reading_head, "\"");
    }
    if (new_index && ae->feature_space[index].size() > 0)
      ae->indices.push_back(index);
  }